

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-map.c
# Opt level: O0

void light_room(loc grid,_Bool light)

{
  _Bool _Var1;
  point_set *seen;
  loc grid_00;
  point_set *ps;
  wchar_t local_18;
  wchar_t d;
  wchar_t i;
  _Bool light_local;
  loc grid_local;
  
  seen = (point_set *)point_set_new(200);
  cave_room_aux(seen,grid);
  for (local_18 = L'\0'; local_18 < seen->n; local_18 = local_18 + L'\x01') {
    _Var1 = square_isprojectable((chunk *)cave,*(loc_conflict *)(seen->pts + local_18));
    if (_Var1) {
      for (ps._4_4_ = 0; ps._4_4_ < 8; ps._4_4_ = ps._4_4_ + 1) {
        grid_00 = loc_sum(seen->pts[local_18],ddgrid_ddd[ps._4_4_]);
        cave_room_aux(seen,grid_00);
      }
    }
  }
  if (light) {
    cave_light(seen);
  }
  else {
    cave_unlight(seen);
  }
  point_set_dispose((point_set_conflict *)seen);
  player->upkeep->update = player->upkeep->update | 0xc0;
  update_stuff(player);
  return;
}

Assistant:

void light_room(struct loc grid, bool light)
{
	int i, d;
	struct point_set *ps;

	ps = point_set_new(200);

	/* Add the initial grid */
	cave_room_aux(ps, grid);

	/* While grids are in the queue, add their neighbors */
	for (i = 0; i < ps->n; i++) {
		/* Walls get lit, but stop light */
		if (!square_isprojectable(cave, ps->pts[i])) continue;

		/* Spread to the adjacent grids */
		for (d = 0; d < 8; d++) {
			cave_room_aux(ps, loc_sum(ps->pts[i], ddgrid_ddd[d]));
		}
	}

	/* Now, lighten or darken them all at once */
	if (light) {
		cave_light(ps);
	} else {
		cave_unlight(ps);
	}
	point_set_dispose(ps);

	/* Fully update the visuals */
	player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

	/* Update stuff */
	update_stuff(player);
}